

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void printTo<char_const*>(FILE *fp,String *fmtstr,char **args)

{
  char *local_30 [4];
  
  format<char_const*>((String *)local_30,fmtstr,args);
  fputs(local_30[0],(FILE *)fp);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void printTo (FILE* fp, const String& fmtstr, const argtypes&... args)
{
	fprintf (fp, "%s", format (fmtstr, args...).c_str());
}